

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChVector<double>::operator=
          (ChVector<double> *this,
          MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *vec)

{
  ulong uVar1;
  double *pdVar2;
  
  uVar1 = *(ulong *)(vec + 8);
  if (0 < (long)uVar1) {
    pdVar2 = *(double **)vec;
    this->m_data[0] = *pdVar2;
    if ((uVar1 != 1) && (this->m_data[1] = pdVar2[1], 2 < uVar1)) {
      this->m_data[2] = pdVar2[2];
      return this;
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, 6, 1>, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Block<Eigen::Matrix<double, 6, 1>, -1, 1>, Level = 0]"
               );
}

Assistant:

ChVector& operator=(const Eigen::MatrixBase<Derived>& vec) {
        m_data[0] = vec(0);
        m_data[1] = vec(1);
        m_data[2] = vec(2);
        return *this;
    }